

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixCase::createInstance(ShaderMatrixCase *this,Context *context)

{
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  Precision PVar1;
  MatrixOp MVar2;
  int iVar3;
  ShaderEvaluator *evaluator;
  _func_int **pp_Var4;
  pointer pMVar5;
  ShaderRenderCaseInstance *pSVar6;
  ShaderRenderCaseInstance *this_01;
  bool bVar7;
  undefined4 uVar8;
  ShaderRenderCaseInstance *pSVar9;
  ShaderRenderCaseInstance *pSVar10;
  InternalError *this_02;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  int row;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  deUint32 bindingLocation;
  float fVar19;
  float local_9c;
  ShaderRenderCaseInstance *local_98;
  ShaderRenderCaseInstance *local_90;
  ShaderRenderCaseInstance *local_88;
  undefined8 local_80;
  Precision local_78;
  Matrix<float,_4,_4> local_70;
  
  pSVar9 = (ShaderRenderCaseInstance *)operator_new(0x230);
  bVar7 = (this->super_ShaderRenderCase).m_isVertexCase;
  evaluator = (this->super_ShaderRenderCase).m_evaluator.
              super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
              .m_data.ptr;
  pp_Var4 = *(_func_int ***)&this->m_in0;
  PVar1 = (this->m_in0).precision;
  local_78 = (this->m_in1).precision;
  local_80._0_4_ = (this->m_in1).inputType;
  local_80._4_4_ = (this->m_in1).dataType;
  MVar2 = this->m_op;
  UniformSetup::UniformSetup((UniformSetup *)&local_70,(UniformSetupFunc)0x0);
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (pSVar9,context,bVar7,evaluator,(UniformSetup *)&local_70,(AttributeSetupFunc)0x0,
             IMAGE_BACKING_MODE_REGULAR,(uint)(byte)(MVar2 == OP_INVERSE & bVar7) << 6);
  UniformSetup::~UniformSetup((UniformSetup *)&local_70);
  (pSVar9->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__ShaderRenderCaseInstance_00bffaa8;
  pSVar9[1].super_TestInstance._vptr_TestInstance = pp_Var4;
  *(Precision *)&pSVar9[1].super_TestInstance.m_context = PVar1;
  *(undefined8 *)((long)&pSVar9[1].super_TestInstance.m_context + 4) = local_80;
  pSVar9[1].m_quadGridSize = local_78;
  *(MatrixOp *)
   &pSVar9[1].m_sparseContext.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
    .m_data.ptr = MVar2;
  this_00 = &pSVar9->m_userAttribTransforms;
  local_88 = pSVar9;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (this_00,4);
  local_90 = pSVar9 + 1;
  local_98 = (ShaderRenderCaseInstance *)((long)&pSVar9[1].super_TestInstance.m_context + 4);
  uVar13 = 1;
  uVar12 = 3;
  lVar18 = 0;
  uVar11 = 0;
  for (lVar17 = 0; this_01 = local_88, pSVar6 = local_90, pSVar9 = local_98, lVar17 != 0x100;
      lVar17 = lVar17 + 0x40) {
    local_9c = 0.0;
    tcu::Matrix<float,_4,_4>::Matrix(&local_70,&local_9c);
    tcu::Matrix<float,_4,_4>::operator=
              ((Matrix<float,_4,_4> *)
               ((long)(((this_00->
                        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
               lVar17),&local_70);
    pMVar5 = (this_00->
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)((pMVar5->m_data).m_data + 3) + lVar17) = 0x3dcccccd3e4ccccd;
    *(float *)((long)((pMVar5->m_data).m_data + 3) + 8U + lVar17) = (float)(int)uVar11 * 0.15 + 0.4;
    *(undefined4 *)((long)((pMVar5->m_data).m_data + 3) + 0xcU + lVar17) = 0x3f333333;
    *(undefined4 *)((long)(pMVar5->m_data).m_data[0].m_data + lVar18) = 0x3f800000;
    *(undefined4 *)((long)((pMVar5->m_data).m_data + 1) + (ulong)(uVar13 & 3) * 4 + lVar17) =
         0x3f800000;
    *(undefined4 *)((long)((pMVar5->m_data).m_data + 2) + (uVar11 ^ 2) * 4 + lVar17) = 0x3f800000;
    *(undefined4 *)((long)((pMVar5->m_data).m_data + 3) + (ulong)(uVar12 & 3) * 4 + lVar17) =
         0x3f800000;
    lVar18 = lVar18 + 0x44;
    uVar13 = (uVar13 & 3) + 1;
    uVar12 = (uVar12 & 3) + 1;
    uVar11 = uVar11 + 1;
  }
  MVar2 = *(MatrixOp *)
           &local_88[1].m_sparseContext.
            super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
            .m_data.ptr;
  uVar8 = 1;
  switch(MVar2) {
  case OP_ADD:
  case OP_SUB:
  case OP_MUL:
  case OP_DIV:
  case OP_COMP_MUL:
  case OP_OUTER_PRODUCT:
  case OP_TRANSPOSE:
  case OP_INVERSE:
  case OP_DETERMINANT:
  case OP_POST_DECREMENT:
  case OP_ADD_INTO:
    goto switchD_005ab092_caseD_0;
  case OP_UNARY_PLUS:
  case OP_DIVIDE_INTO:
    uVar8 = 3;
    break;
  case OP_NEGATION:
    uVar8 = 4;
    break;
  case OP_PRE_INCREMENT:
  case OP_POST_INCREMENT:
  case OP_MULTIPLY_INTO:
    break;
  case OP_PRE_DECREMENT:
    uVar8 = 2;
    break;
  case OP_SUBTRACT_FROM:
    uVar8 = 5;
    break;
  default:
    uVar8 = 6;
  }
  lVar17 = 0;
  for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
    lVar14 = lVar17;
    for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
      pMVar5 = (this_00->
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (lVar16 = 0; lVar16 != 0x40; lVar16 = lVar16 + 0x10) {
        switch(uVar8) {
        case 1:
          fVar19 = -*(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar16 + lVar14);
          break;
        case 2:
          fVar19 = *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar16 + lVar14) + 0.3;
          break;
        case 3:
          fVar19 = *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar16 + lVar14) + -0.3;
          break;
        case 4:
          fVar19 = 0.3 - *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar16 + lVar14);
          break;
        case 5:
          fVar19 = *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar16 + lVar14) + -0.1;
          break;
        default:
          goto switchD_005ab181_default;
        }
        *(float *)((long)(pMVar5->m_data).m_data[0].m_data + lVar16 + lVar14) = fVar19;
switchD_005ab181_default:
      }
      lVar14 = lVar14 + 4;
    }
    lVar17 = lVar17 + 0x40;
  }
switchD_005ab092_caseD_0:
  bVar7 = MatrixCaseUtils::isOperationBinary(MVar2);
  bindingLocation = 4;
  do {
    if (~(uint)bVar7 + bindingLocation == 4) {
      return &this_01->super_TestInstance;
    }
    pSVar10 = pSVar9;
    if (bindingLocation == 4) {
      pSVar10 = pSVar6;
    }
    if (*(int *)&(pSVar10->super_TestInstance)._vptr_TestInstance == 2) {
      iVar3 = *(int *)((long)&(pSVar10->super_TestInstance)._vptr_TestInstance + 4);
      if (iVar3 - 5U < 9 || iVar3 - 0x12U < 9) {
        if (8 < iVar3 - 5U) {
          this_02 = (InternalError *)__cxa_allocate_exception(0x38);
          tcu::InternalError::InternalError
                    (this_02,"Not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderMatrixTests.cpp"
                     ,0x563);
          __cxa_throw(this_02,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        }
        ShaderRenderCaseInstance::useAttribute(this_01,bindingLocation,iVar3 - A_IN1);
      }
    }
    bindingLocation = bindingLocation + 1;
  } while( true );
}

Assistant:

TestInstance* ShaderMatrixCase::createInstance (Context& context) const
{
	return new ShaderMatrixInstance(context, m_isVertexCase, *m_evaluator, m_in0, m_in1, m_op);
}